

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zreadhb.c
# Opt level: O0

void zreadhb(FILE *fp,int *nrow,int *ncol,int_t *nonz,doublecomplex **nzval,int_t **rowind,
            int_t **colptr)

{
  int iVar1;
  bool local_d1;
  undefined1 local_cc;
  char local_cb;
  undefined1 local_c9;
  int sym;
  char type [4];
  char buf [100];
  int local_5c;
  int valsize;
  int valnum;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  int tmp;
  int rhscrd;
  int numer_lines;
  int i;
  int_t **rowind_local;
  doublecomplex **nzval_local;
  int_t *nonz_local;
  int *ncol_local;
  int *nrow_local;
  FILE *fp_local;
  
  tmp = 0;
  colnum = 0;
  _numer_lines = rowind;
  rowind_local = (int_t **)nzval;
  nzval_local = (doublecomplex **)nonz;
  nonz_local = ncol;
  ncol_local = nrow;
  nrow_local = &fp->_flags;
  fgets((char *)&sym,100,(FILE *)fp);
  fputs((char *)&sym,_stdout);
  for (rhscrd = 0; rhscrd < 5; rhscrd = rhscrd + 1) {
    __isoc99_fscanf(nrow_local,"%14c",&sym);
    buf[6] = '\0';
    __isoc99_sscanf(&sym,"%d",&colsize);
    if (rhscrd == 3) {
      tmp = colsize;
    }
    if ((rhscrd == 4) && (colsize != 0)) {
      colnum = colsize;
    }
  }
  zDumpLine((FILE *)nrow_local);
  __isoc99_fscanf(nrow_local,"%3c",&local_cc);
  __isoc99_fscanf(nrow_local,"%11c",&sym);
  local_c9 = 0;
  __isoc99_fscanf(nrow_local,"%14c",&sym);
  iVar1 = atoi((char *)&sym);
  *ncol_local = iVar1;
  __isoc99_fscanf(nrow_local,"%14c",&sym);
  iVar1 = atoi((char *)&sym);
  *nonz_local = iVar1;
  __isoc99_fscanf(nrow_local,"%14c",&sym);
  iVar1 = atoi((char *)&sym);
  *(int *)nzval_local = iVar1;
  __isoc99_fscanf(nrow_local,"%14c",&sym);
  colsize = atoi((char *)&sym);
  if (colsize != 0) {
    printf("This is not an assembled matrix!\n");
  }
  if (*ncol_local != *nonz_local) {
    printf("Matrix is not square.\n");
  }
  zDumpLine((FILE *)nrow_local);
  zallocateA(*nonz_local,*(int_t *)nzval_local,(doublecomplex **)rowind_local,_numer_lines,colptr);
  __isoc99_fscanf(nrow_local,"%16c",&sym);
  zParseIntFormat((char *)&sym,&rownum,&rowsize);
  __isoc99_fscanf(nrow_local,"%16c",&sym);
  zParseIntFormat((char *)&sym,&valnum,&valsize);
  __isoc99_fscanf(nrow_local,"%20c",&sym);
  zParseFloatFormat((char *)&sym,&local_5c,(int *)(buf + 0x60));
  __isoc99_fscanf(nrow_local,"%20c",&sym);
  zDumpLine((FILE *)nrow_local);
  if (colnum != 0) {
    zDumpLine((FILE *)nrow_local);
  }
  ReadVector((FILE *)nrow_local,*nonz_local + 1,*colptr,rownum,rowsize);
  ReadVector((FILE *)nrow_local,*(int_t *)nzval_local,*_numer_lines,valnum,valsize);
  if (tmp != 0) {
    zReadValues((FILE *)nrow_local,*(int *)nzval_local,(doublecomplex *)*rowind_local,local_5c,
                buf._96_4_);
  }
  local_d1 = local_cb == 'S' || local_cb == 's';
  if (local_d1) {
    FormFullA(*nonz_local,(int_t *)nzval_local,(doublecomplex **)rowind_local,_numer_lines,colptr);
  }
  fclose((FILE *)nrow_local);
  return;
}

Assistant:

void
zreadhb(FILE *fp, int *nrow, int *ncol, int_t *nonz,
	doublecomplex **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0, rhscrd = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<5; i++) {
	fscanf(fp, "%14c", buf); buf[14] = 0;
	sscanf(buf, "%d", &tmp);
	if (i == 3) numer_lines = tmp;
	if (i == 4 && tmp) rhscrd = tmp;
    }
    zDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#if ( DEBUGlevel>=1 )
    printf("Matrix type %s\n", type);
#endif
    
    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);
    
    if (tmp != 0)
	  printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
	printf("Matrix is not square.\n");
    zDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    zallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    zParseFloatFormat(buf, &valnum, &valsize);
    fscanf(fp, "%20c", buf);
    zDumpLine(fp);

    /* Line 5: right-hand side */    
    if ( rhscrd ) zDumpLine(fp); /* skip RHSFMT */
    
#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif
    
    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        zReadValues(fp, *nonz, *nzval, valnum, valsize);
    }
    
    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}